

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O2

void BinaryenStoreSetPtr(BinaryenExpressionRef expr,BinaryenExpressionRef ptrExpr)

{
  if (expr->_id != StoreId) {
    __assert_fail("expression->is<Store>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                  ,0xa99,"void BinaryenStoreSetPtr(BinaryenExpressionRef, BinaryenExpressionRef)");
  }
  if (ptrExpr != (BinaryenExpressionRef)0x0) {
    *(BinaryenExpressionRef *)(expr + 3) = ptrExpr;
    return;
  }
  __assert_fail("ptrExpr",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                ,0xa9a,"void BinaryenStoreSetPtr(BinaryenExpressionRef, BinaryenExpressionRef)");
}

Assistant:

void BinaryenStoreSetPtr(BinaryenExpressionRef expr,
                         BinaryenExpressionRef ptrExpr) {
  auto* expression = (Expression*)expr;
  assert(expression->is<Store>());
  assert(ptrExpr);
  static_cast<Store*>(expression)->ptr = (Expression*)ptrExpr;
}